

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O0

void __thiscall Darts::Details::DoubleArrayBuilder::reserve_id(DoubleArrayBuilder *this,id_type id)

{
  id_type iVar1;
  ulong uVar2;
  size_t sVar3;
  extra_type *peVar4;
  DoubleArrayBuilder *this_00;
  extra_type *this_01;
  uint in_ESI;
  long in_RDI;
  id_type in_stack_ffffffffffffffcc;
  DoubleArrayBuilder *in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar2 = (ulong)in_ESI;
  sVar3 = AutoPool<Darts::Details::DoubleArrayBuilderUnit>::size
                    ((AutoPool<Darts::Details::DoubleArrayBuilderUnit> *)(in_RDI + 8));
  if (sVar3 <= uVar2) {
    expand_units((DoubleArrayBuilder *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  }
  if (in_ESI == *(uint *)(in_RDI + 0x48)) {
    peVar4 = extras(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    iVar1 = DoubleArrayBuilderExtraUnit::next(peVar4);
    *(id_type *)(in_RDI + 0x48) = iVar1;
    if (*(uint *)(in_RDI + 0x48) == in_ESI) {
      sVar3 = AutoPool<Darts::Details::DoubleArrayBuilderUnit>::size
                        ((AutoPool<Darts::Details::DoubleArrayBuilderUnit> *)(in_RDI + 8));
      *(int *)(in_RDI + 0x48) = (int)sVar3;
    }
  }
  peVar4 = extras(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  DoubleArrayBuilderExtraUnit::prev(peVar4);
  this_00 = (DoubleArrayBuilder *)extras(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  peVar4 = extras(this_00,in_stack_ffffffffffffffcc);
  iVar1 = DoubleArrayBuilderExtraUnit::next(peVar4);
  DoubleArrayBuilderExtraUnit::set_next((DoubleArrayBuilderExtraUnit *)this_00,iVar1);
  peVar4 = extras(this_00,in_stack_ffffffffffffffcc);
  DoubleArrayBuilderExtraUnit::next(peVar4);
  peVar4 = extras(this_00,in_stack_ffffffffffffffcc);
  this_01 = extras(this_00,in_stack_ffffffffffffffcc);
  iVar1 = DoubleArrayBuilderExtraUnit::prev(this_01);
  DoubleArrayBuilderExtraUnit::set_prev(peVar4,iVar1);
  peVar4 = extras(this_00,in_stack_ffffffffffffffcc);
  DoubleArrayBuilderExtraUnit::set_is_fixed(peVar4,true);
  return;
}

Assistant:

inline void DoubleArrayBuilder::reserve_id(id_type id) {
  if (id >= units_.size()) {
    expand_units();
  }

  if (id == extras_head_) {
    extras_head_ = extras(id).next();
    if (extras_head_ == id) {
      extras_head_ = units_.size();
    }
  }
  extras(extras(id).prev()).set_next(extras(id).next());
  extras(extras(id).next()).set_prev(extras(id).prev());
  extras(id).set_is_fixed(true);
}